

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNlaProductForm.cpp
# Opt level: O2

void __thiscall ProductFormUpdate::ftran(ProductFormUpdate *this,HVector *rhs)

{
  int iVar1;
  int iVar2;
  pointer pdVar3;
  pointer pcVar4;
  HighsInt iX;
  long lVar5;
  long lVar6;
  pointer piVar7;
  double dVar8;
  
  if (this->valid_ == true) {
    for (lVar5 = 0; lVar5 < rhs->count; lVar5 = lVar5 + 1) {
      (rhs->cwork).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start[(rhs->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar5]] = '\x01';
    }
    for (lVar5 = 0; lVar5 < this->update_count_; lVar5 = lVar5 + 1) {
      iVar1 = (this->pivot_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar5];
      pdVar3 = (rhs->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (ABS(pdVar3[iVar1]) <= 1e-14) {
        pdVar3[iVar1] = 0.0;
      }
      else {
        dVar8 = pdVar3[iVar1] /
                (this->pivot_value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar5];
        pdVar3[iVar1] = dVar8;
        piVar7 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (lVar6 = (long)piVar7[lVar5]; lVar6 < piVar7[lVar5 + 1]; lVar6 = lVar6 + 1) {
          iVar1 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar6];
          pdVar3 = (rhs->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar3[iVar1] =
               (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar6] * -dVar8 + pdVar3[iVar1];
          pcVar4 = (rhs->cwork).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (pcVar4[iVar1] == '\0') {
            pcVar4[iVar1] = '\x01';
            iVar2 = rhs->count;
            rhs->count = iVar2 + 1;
            (rhs->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar2] = iVar1;
            piVar7 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          }
        }
      }
    }
    for (lVar5 = 0; lVar5 < rhs->count; lVar5 = lVar5 + 1) {
      (rhs->cwork).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start[(rhs->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar5]] = '\0';
    }
  }
  return;
}

Assistant:

void ProductFormUpdate::ftran(HVector& rhs) const {
  if (!valid_) return;
  assert(rhs.size == num_row_);
  assert((int)start_.size() == update_count_ + 1);
  // Use the zeroed rhs.cwork to record whether a row is in the index
  // list. If RHS fill-in occurs in a row, then we have to add it to
  // the list. We're not tracking cancellation, so we don't need to
  // know where a row appears in the list
  vector<char>& in_index = rhs.cwork;
  for (HighsInt iX = 0; iX < rhs.count; iX++) in_index[rhs.index[iX]] = 1;

  for (HighsInt iX = 0; iX < update_count_; iX++) {
    const HighsInt pivot_index = pivot_index_[iX];
    double pivot_value = rhs.array[pivot_index];
    if (fabs(pivot_value) > kHighsTiny) {
      assert(in_index[pivot_index]);
      pivot_value /= pivot_value_[iX];
      rhs.array[pivot_index] = pivot_value;
      for (HighsInt iEl = start_[iX]; iEl < start_[iX + 1]; iEl++) {
        HighsInt iRow = index_[iEl];
        rhs.array[iRow] -= pivot_value * value_[iEl];
        if (in_index[iRow]) continue;
        in_index[iRow] = 1;
        rhs.index[rhs.count++] = iRow;
      }
    } else {
      rhs.array[pivot_index] = 0;
    }
  }
  // Zero the in_index entries used to point into the index list
  for (HighsInt iX = 0; iX < rhs.count; iX++) in_index[rhs.index[iX]] = 0;
}